

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O0

Printed * __thiscall
wasm::TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter>::operator()
          (Printed *__return_storage_ptr__,
          TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter> *this,Type type)

{
  anon_class_8_1_8991fb9c local_48;
  HeapTypeNameGenerator local_40;
  TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter> *local_20;
  TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter> *this_local;
  Type type_local;
  
  local_48.this = this;
  local_20 = this;
  this_local = (TypeNameGeneratorBase<wasm::PrintSExpression::TypePrinter> *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  std::function<wasm::TypeNames(wasm::HeapType)>::operator()
            ((function<wasm::TypeNames(wasm::HeapType)> *)&local_40,&local_48);
  wasm::Type::print(__return_storage_ptr__,(Type *)&this_local,&local_40);
  std::function<wasm::TypeNames_(wasm::HeapType)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Type::Printed operator()(Type type) {
    return type.print(
      [&](HeapType ht) { return static_cast<Subclass*>(this)->getNames(ht); });
  }